

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-bitflag.c
# Opt level: O0

_Bool flags_clear(bitflag *flags,size_t size,...)

{
  char in_AL;
  uint uVar1;
  ulong uVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int *local_138;
  int local_108 [4];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  _Bool local_49;
  uint local_48;
  undefined4 uStack_44;
  _Bool delta;
  va_list args;
  int local_28;
  int f;
  int flag_binary;
  size_t flag_offset;
  size_t size_local;
  bitflag *flags_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  args[0].overflow_arg_area = local_108;
  args[0]._0_8_ = &stack0x00000008;
  uStack_44 = 0x30;
  local_48 = 0x18;
  local_49 = false;
  local_28 = (int)local_f8;
  while( true ) {
    if (local_28 == 0) {
      return local_49;
    }
    uVar2 = (ulong)(long)(local_28 + -1) >> 3;
    uVar1 = 1 << ((char)local_28 - 1U & 7);
    if (size <= uVar2) break;
    if ((flags[uVar2] & uVar1) != 0) {
      local_49 = true;
    }
    flags[uVar2] = flags[uVar2] & ((byte)uVar1 ^ 0xff);
    if (local_48 < 0x29) {
      local_138 = (int *)((long)args[0].overflow_arg_area + (long)(int)local_48);
      local_48 = local_48 + 8;
    }
    else {
      local_138 = (int *)args[0]._0_8_;
      args[0]._0_8_ = args[0]._0_8_ + 8;
    }
    local_28 = *local_138;
  }
  local_f8 = in_RDX;
  local_f0 = in_RCX;
  local_e8 = in_R8;
  local_e0 = in_R9;
  __assert_fail("flag_offset < size",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-bitflag.c"
                ,0x1db,"_Bool flags_clear(bitflag *, const size_t, ...)");
}

Assistant:

bool flags_clear(bitflag *flags, const size_t size, ...)
{
	size_t flag_offset;
	int flag_binary;
	int f;
	va_list args;
	bool delta = false;

	va_start(args, size);

	/* Process each flag in the va-args */
	for (f = va_arg(args, int); f != FLAG_END; f = va_arg(args, int)) {
		flag_offset = FLAG_OFFSET(f);
		flag_binary = FLAG_BINARY(f);

		assert(flag_offset < size);

		/* flag_has() */
		if (flags[flag_offset] & flag_binary) delta = true;

		/* flag_off() */
		flags[flag_offset] &= ~flag_binary;
	}

	va_end(args);

	return delta;
}